

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O1

bool __thiscall
PruneReplayer::filter_timestamp(PruneReplayer *this,ResourceTag tag,Hash hash,uint64_t *ts)

{
  DatabaseInterface *pDVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  size_t timestamp_size;
  uint64_t timestamp;
  long local_30;
  ulong local_28;
  
  pDVar1 = (this->timestamp_db)._M_t.
           super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
  if (pDVar1 == (DatabaseInterface *)0x0) {
    bVar3 = true;
  }
  else {
    local_28 = 0;
    local_30 = 8;
    iVar4 = (*pDVar1->_vptr_DatabaseInterface[3])(pDVar1,tag,(char)hash,&local_30,&local_28,0);
    uVar2 = this->timestamp_minimum_accept;
    if (ts != (uint64_t *)0x0) {
      *ts = local_28;
    }
    bVar3 = (bool)((byte)iVar4 & (uVar2 <= local_28 && local_30 == 8));
  }
  return bVar3;
}

Assistant:

bool filter_timestamp(ResourceTag tag, Hash hash, uint64_t *ts) const
	{
		if (!timestamp_db)
			return true;

		uint64_t timestamp = 0;
		bool ret = true;

		size_t timestamp_size = sizeof(timestamp);
		if (!timestamp_db->read_entry(tag, hash, &timestamp_size, &timestamp, PAYLOAD_READ_NO_FLAGS) ||
		    timestamp_size != sizeof(timestamp))
		{
			ret = false;
		}

		if (timestamp < timestamp_minimum_accept)
			ret = false;

		if (ts)
			*ts = timestamp;

		return ret;
	}